

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units_construct_Test::TestBody(Units_construct_Test *this)

{
  char *pcVar1;
  AssertHelper local_80 [8];
  string validName;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  AssertionResult gtest_ar_1;
  UnitsPtr u;
  
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validName,"valid_name",(allocator<char> *)&gtest_ar);
  libcellml::NamedEntity::setName
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validName);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"valid_name\"","u->name()",(char (*) [11])0x14b29f,&validName);
  std::__cxx11::string::~string((string *)&validName);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&validName);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u2,(Message *)&validName);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&validName);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validName,"another_valid_name",(allocator<char> *)&gtest_ar);
  libcellml::Units::create((string *)&u2);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"another_valid_name\"","u2->name()",
             (char (*) [19])"another_valid_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x1f,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&validName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, construct)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("valid_name");
    EXPECT_EQ("valid_name", u->name());

    const std::string validName = "another_valid_name";
    auto u2 = libcellml::Units::create(validName);
    EXPECT_EQ("another_valid_name", u2->name());
}